

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.cc
# Opt level: O3

void matras_alloc_test(void)

{
  void *pvVar1;
  matras_id_t mVar2;
  long lVar3;
  _Base_ptr p_Var4;
  void *pvVar5;
  _Base_ptr p_Var6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  undefined1 local_98 [8];
  matras mat;
  void *pvStack_38;
  uint res;
  void *data;
  
  plan(1);
  _space(_stdout);
  uVar10 = 0;
  printf("# *** %s ***\n","matras_alloc_test");
  alloc_err_inj_enabled = false;
  do {
    matras_create((matras *)local_98,0x10,&pta_allocator,(matras_stats *)0x0);
    if (mat._40_8_ != 0x100) goto LAB_00103361;
    std::
    _Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>::
    clear(&AllocatedItems._M_t);
    if (uVar10 != 0) {
      uVar7 = 0;
      do {
        mat.stats._4_4_ = 0;
        pvStack_38 = matras_alloc((matras *)local_98,(matras_id_t *)((long)&mat.stats + 4));
        if (pvStack_38 == (void *)0x0) {
LAB_00103310:
          matras_alloc_test();
LAB_00103315:
          matras_alloc_test();
LAB_0010331a:
          matras_alloc_test();
LAB_0010331f:
          matras_alloc_test();
LAB_00103324:
          __assert_fail("id < v->block_count",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/matras.h"
                        ,0x1ab,
                        "void *matras_view_get_no_check(const struct matras *, const struct matras_view *, matras_id_t)"
                       );
        }
        if (CONCAT44(mat.head.root._4_4_,(uint)mat.head.root) <= (ulong)mat.stats._4_4_)
        goto LAB_00103324;
        if (pvStack_38 !=
            (void *)((ulong)((mat.stats._4_4_ & mat.shift2) * (int)mat.head.next_view) +
                    *(long *)(*(long *)((long)local_98 +
                                       (ulong)(mat.stats._4_4_ >> ((byte)mat.capacity & 0x1f)) * 8)
                             + (ulong)((mat.shift1 & mat.stats._4_4_) >> (mat.capacity._4_1_ & 0x1f)
                                      ) * 8))) goto LAB_00103315;
        mVar2 = matras_extent_count((matras *)local_98);
        if ((AllocatedCount & 0x3ffffffffffffff) != (ulong)mVar2) goto LAB_0010331a;
        if (mat.stats._4_4_ != uVar7) goto LAB_0010331f;
        if (AllocatedBlocks._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
          matras_alloc_test();
          goto LAB_00103310;
        }
        p_Var6 = &AllocatedBlocks._M_t._M_impl.super__Rb_tree_header._M_header;
        if (AllocatedBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0
           ) {
LAB_0010305d:
          if (p_Var6 == AllocatedBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
          goto LAB_0010334d;
          lVar3 = std::_Rb_tree_decrement(p_Var6);
          if (lVar3 == 0x109148) goto LAB_00103352;
          pvVar5 = *(void **)(lVar3 + 0x20);
        }
        else {
          p_Var4 = &AllocatedBlocks._M_t._M_impl.super__Rb_tree_header._M_header;
          p_Var6 = AllocatedBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            if (*(void **)(p_Var6 + 1) >= pvStack_38) {
              p_Var4 = p_Var6;
            }
            p_Var6 = (&p_Var6->_M_left)[*(void **)(p_Var6 + 1) < pvStack_38];
          } while (p_Var6 != (_Base_ptr)0x0);
          p_Var6 = &AllocatedBlocks._M_t._M_impl.super__Rb_tree_header._M_header;
          if (((_Rb_tree_header *)p_Var4 == &AllocatedBlocks._M_t._M_impl.super__Rb_tree_header) ||
             (pvVar5 = *(void **)(p_Var4 + 1), p_Var6 = p_Var4, pvVar5 != pvStack_38))
          goto LAB_0010305d;
        }
        pvVar1 = pvStack_38;
        if ((void *)((long)pvVar5 + 0x30U) < pvStack_38) {
          matras_alloc_test();
          goto LAB_00103348;
        }
        if (AllocatedItems._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          p_Var6 = &AllocatedItems._M_t._M_impl.super__Rb_tree_header._M_header;
          if (AllocatedItems._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
              (_Base_ptr)0x0) {
            p_Var4 = &AllocatedItems._M_t._M_impl.super__Rb_tree_header._M_header;
            p_Var6 = AllocatedItems._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            do {
              if (*(void **)(p_Var6 + 1) >= pvStack_38) {
                p_Var4 = p_Var6;
              }
              p_Var6 = (&p_Var6->_M_left)[*(void **)(p_Var6 + 1) < pvStack_38];
            } while (p_Var6 != (_Base_ptr)0x0);
            p_Var6 = &AllocatedItems._M_t._M_impl.super__Rb_tree_header._M_header;
            if (((_Rb_tree_header *)p_Var4 != &AllocatedItems._M_t._M_impl.super__Rb_tree_header) &&
               (p_Var6 = p_Var4, *(ulong *)(p_Var4 + 1) < (long)pvStack_38 + 0x10U))
            goto LAB_0010335c;
          }
          if ((p_Var6 != AllocatedItems._M_t._M_impl.super__Rb_tree_header._M_header._M_left) &&
             (lVar3 = std::_Rb_tree_decrement(p_Var6),
             pvVar1 < (void *)(*(long *)(lVar3 + 0x20) + 0x10))) goto LAB_00103357;
        }
        std::_Rb_tree<void*,void*,std::_Identity<void*>,std::less<void*>,std::allocator<void*>>::
        _M_insert_unique<void*const&>
                  ((_Rb_tree<void*,void*,std::_Identity<void*>,std::less<void*>,std::allocator<void*>>
                    *)&AllocatedItems,&stack0xffffffffffffffc8);
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar10);
    }
    mVar2 = matras_extent_count((matras *)local_98);
    if ((AllocatedCount & 0x3ffffffffffffff) != (ulong)mVar2) goto LAB_00103366;
    matras_destroy((matras *)local_98);
    if (AllocatedCount != 0) goto LAB_0010336b;
    uVar10 = uVar10 + 1;
  } while (uVar10 != 0x101);
  iVar8 = 0;
  do {
    matras_create((matras *)local_98,0x10,&pta_allocator,(matras_stats *)0x0);
    iVar11 = iVar8;
    if (iVar8 != 0) {
      do {
        pvStack_38 = (void *)((ulong)pvStack_38 & 0xffffffff00000000);
        matras_alloc((matras *)local_98,(matras_id_t *)&stack0xffffffffffffffc8);
        iVar11 = iVar11 + -1;
        iVar12 = iVar8;
      } while (iVar11 != 0);
      do {
        matras_dealloc((matras *)local_98);
        mVar2 = matras_extent_count((matras *)local_98);
        if ((AllocatedCount & 0x3ffffffffffffff) != (ulong)mVar2) goto LAB_00103348;
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
    }
    if (AllocatedCount != 0) goto LAB_00103370;
    matras_destroy((matras *)local_98);
    iVar8 = iVar8 + 1;
  } while (iVar8 != 0x101);
  alloc_err_inj_enabled = true;
  uVar10 = 0;
  do {
    matras_create((matras *)local_98,0x10,&pta_allocator,(matras_stats *)0x0);
    iVar8 = 0x100;
    alloc_err_inj_countdown = uVar10;
    do {
      pvStack_38 = (void *)((ulong)pvStack_38 & 0xffffffff00000000);
      uVar9 = (ulong)(uint)mat.head.root;
      pvVar5 = matras_alloc((matras *)local_98,(matras_id_t *)&stack0xffffffffffffffc8);
      if (pvVar5 == (void *)0x0) {
        if (uVar9 != CONCAT44(mat.head.root._4_4_,(uint)mat.head.root)) goto LAB_0010337a;
        break;
      }
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
    matras_destroy((matras *)local_98);
    if (AllocatedCount != 0) goto LAB_00103375;
    uVar10 = uVar10 + 1;
    if (uVar10 == 0x101) {
      alloc_err_inj_enabled = false;
      _ok(1,"true",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x8b,
          "line %d",0x8b);
      _space(_stdout);
      printf("# *** %s: done ***\n","matras_alloc_test");
      check_plan();
      return;
    }
  } while( true );
LAB_00103348:
  matras_alloc_test();
LAB_0010334d:
  matras_alloc_test();
LAB_00103352:
  matras_alloc_test();
LAB_00103357:
  matras_alloc_test();
LAB_0010335c:
  matras_alloc_test();
LAB_00103361:
  matras_alloc_test();
LAB_00103366:
  matras_alloc_test();
LAB_0010336b:
  matras_alloc_test();
LAB_00103370:
  matras_alloc_test();
LAB_00103375:
  matras_alloc_test();
LAB_0010337a:
  matras_alloc_test();
  extents_in_use = extents_in_use + 1;
  malloc(0x200);
  return;
}

Assistant:

void matras_alloc_test()
{
	plan(1);
	header();

	unsigned int maxCapacity =  PROV_EXTENT_SIZE / PROV_BLOCK_SIZE;
	maxCapacity *= PROV_EXTENT_SIZE / sizeof(void *);
	maxCapacity *= PROV_EXTENT_SIZE / sizeof(void *);

	struct matras mat;

	alloc_err_inj_enabled = false;
	for (unsigned int i = 0; i <= maxCapacity; i++) {
		matras_create(&mat, PROV_BLOCK_SIZE, &pta_allocator, NULL);
		fail_unless(mat.capacity == maxCapacity);
		AllocatedItems.clear();
		for (unsigned int j = 0; j < i; j++) {
			unsigned int res = 0;
			void *data = matras_alloc(&mat, &res);
			fail_unless(data != NULL);
			void *test_data = matras_get(&mat, res);
			fail_unless(data == test_data);
			size_t provConsumedMemory = (size_t)matras_extent_count(&mat) * PROV_EXTENT_SIZE;
			fail_unless(provConsumedMemory == AllocatedCount * PROV_EXTENT_SIZE);
			fail_unless(res == j);
			{
				fail_unless(!AllocatedBlocks.empty());
				std::set<void*>::iterator itr = AllocatedBlocks.lower_bound(data);
				if (itr == AllocatedBlocks.end() || *itr != data) {
					fail_unless(itr != AllocatedBlocks.begin());
					--itr;
				}
				fail_unless(itr != AllocatedBlocks.end());
				fail_unless(data <= (void*)( ((char*)(*itr)) + PROV_EXTENT_SIZE - PROV_BLOCK_SIZE));
			}
			{
				if (!AllocatedItems.empty()) {
					std::set<void*>::iterator itr = AllocatedItems.lower_bound(data);
					if (itr != AllocatedItems.end()) {
						fail_unless(*itr >= (void*)(((char*)data) + PROV_BLOCK_SIZE));
					}
					if (itr != AllocatedItems.begin()) {
						--itr;
						fail_unless(data >= (void*)(((char*)(*itr)) + PROV_BLOCK_SIZE));
					}
				}
			}
			AllocatedItems.insert(data);
		}
		size_t provConsumedMemory = (size_t)matras_extent_count(&mat) * PROV_EXTENT_SIZE;
		fail_unless(provConsumedMemory == AllocatedCount * PROV_EXTENT_SIZE);
		matras_destroy(&mat);
		fail_unless(AllocatedCount == 0);
	}

	for (unsigned int i = 0; i <= maxCapacity; i++) {
		matras_create(&mat, PROV_BLOCK_SIZE, &pta_allocator, NULL);
		for (unsigned int j = 0; j < i; j++) {
			unsigned int res = 0;
			(void) matras_alloc(&mat, &res);
		}
		for (unsigned int j = 0; j < i; j++) {
			matras_dealloc(&mat);
			size_t provConsumedMemory = (size_t)matras_extent_count(&mat) * PROV_EXTENT_SIZE;
			fail_unless(provConsumedMemory == AllocatedCount * PROV_EXTENT_SIZE);
		}
		fail_unless(AllocatedCount == 0);
		matras_destroy(&mat);
	}

	alloc_err_inj_enabled = true;
	for (unsigned int i = 0; i <= maxCapacity; i++) {
		matras_create(&mat, PROV_BLOCK_SIZE, &pta_allocator, NULL);

		alloc_err_inj_countdown = i;

		for (unsigned int j = 0; j < maxCapacity; j++) {
			unsigned int res = 0;
			unsigned int prev_block_count = mat.head.block_count;
			void *data = matras_alloc(&mat, &res);
			if (!data) {
				fail_unless(prev_block_count == mat.head.block_count);
				break;
			}
		}
		matras_destroy(&mat);
		fail_unless(AllocatedCount == 0);
	}

	alloc_err_inj_enabled = false;
	ok(true);

	footer();
	check_plan();
}